

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

uint32_t cpu_ldl_code_mips64(CPUArchState_conflict11 *env,abi_ptr addr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0xa3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0xa0;
  }
  uVar1 = load_helper(env,addr,oi,0,MO_BEUL,true,full_ldl_code);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t cpu_ldl_code(CPUArchState *env, abi_ptr addr)
{
    TCGMemOpIdx oi = make_memop_idx(MO_TEUL, cpu_mmu_index(env, true));
    return full_ldl_code(env, addr, oi, 0);
}